

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hist.c
# Opt level: O2

uint HIST_count_simple(uint *count,uint *maxSymbolValuePtr,void *src,size_t srcSize)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  byte *pbVar5;
  
  uVar1 = *maxSymbolValuePtr;
  uVar3 = 0;
  memset(count,0,(ulong)(uVar1 + 1) << 2);
  if (srcSize == 0) {
    *maxSymbolValuePtr = 0;
  }
  else {
    pbVar5 = (byte *)(srcSize + (long)src);
    for (; src < pbVar5; src = (void *)((long)src + 1)) {
      count[*src] = count[*src] + 1;
    }
    do {
      uVar4 = uVar1;
      uVar1 = uVar4 - 1;
    } while (count[uVar4] == 0);
    *maxSymbolValuePtr = uVar4;
    uVar3 = 0;
    for (uVar2 = 0; uVar2 <= uVar4; uVar2 = uVar2 + 1) {
      if (uVar3 < count[uVar2]) {
        uVar3 = count[uVar2];
      }
    }
  }
  return uVar3;
}

Assistant:

unsigned HIST_count_simple(unsigned* count, unsigned* maxSymbolValuePtr,
                           const void* src, size_t srcSize)
{
    const BYTE* ip = (const BYTE*)src;
    const BYTE* const end = ip + srcSize;
    unsigned maxSymbolValue = *maxSymbolValuePtr;
    unsigned largestCount=0;

    memset(count, 0, (maxSymbolValue+1) * sizeof(*count));
    if (srcSize==0) { *maxSymbolValuePtr = 0; return 0; }

    while (ip<end) {
        assert(*ip <= maxSymbolValue);
        count[*ip++]++;
    }

    while (!count[maxSymbolValue]) maxSymbolValue--;
    *maxSymbolValuePtr = maxSymbolValue;

    {   U32 s;
        for (s=0; s<=maxSymbolValue; s++)
            if (count[s] > largestCount) largestCount = count[s];
    }

    return largestCount;
}